

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac_.c
# Opt level: O3

void qrfac_(int *m,int *n,double *a,int *lda,int *pivot,int *ipvt,int *lipvt,double *rdiag,
           double *acnorm,double *wa)

{
  uint uVar1;
  bool bVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  uint *puVar18;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int c__1;
  uint local_d0;
  uint local_cc;
  double *local_c8;
  ulong local_c0;
  int *local_b8;
  int local_ac;
  uint *local_a8;
  ulong local_a0;
  double *local_98;
  double *local_90;
  uint *local_88;
  long local_80;
  int *local_78;
  long local_70;
  ulong local_68;
  double *local_60;
  double local_58;
  int local_4c;
  double local_48;
  
  local_4c = 1;
  uVar8 = (ulong)*lda;
  pdVar20 = (double *)~uVar8;
  local_b8 = pivot;
  local_a8 = (uint *)m;
  local_78 = ipvt;
  local_58 = dpmpar_(&local_4c);
  uVar6 = *n;
  local_c0 = uVar8;
  local_88 = (uint *)n;
  if (0 < (int)uVar6) {
    pdVar9 = a + uVar8 + (long)pdVar20 + 1U;
    uVar19 = 0;
    local_c8 = pdVar20;
    local_90 = a;
    do {
      dVar22 = enorm_((int *)local_a8,pdVar9);
      acnorm[uVar19] = dVar22;
      rdiag[uVar19] = dVar22;
      wa[uVar19] = dVar22;
      if (*local_b8 != 0) {
        local_78[uVar19] = (int)uVar19 + 1;
      }
      uVar19 = uVar19 + 1;
      pdVar9 = pdVar9 + uVar8;
    } while (uVar6 != uVar19);
    uVar6 = *local_88;
    a = local_90;
    pdVar20 = local_c8;
  }
  if ((int)*local_a8 < (int)uVar6) {
    uVar6 = *local_a8;
  }
  if (0 < (int)uVar6) {
    local_c8 = a + (long)pdVar20;
    local_a0 = (ulong)(uVar6 + 1);
    local_70 = local_c0 * 8;
    local_80 = local_c0 * 8 + 8;
    local_ac = 2;
    piVar14 = local_b8;
    puVar15 = local_a8;
    puVar18 = local_88;
    uVar8 = 1;
    do {
      pdVar20 = local_c8;
      uVar6 = (uint)uVar8;
      if (*piVar14 != 0) {
        uVar4 = uVar6;
        if ((long)uVar8 <= (long)(int)*puVar18) {
          uVar19 = uVar8;
          uVar11 = uVar8 & 0xffffffff;
          do {
            uVar5 = uVar19 & 0xffffffff;
            if (rdiag[uVar19 - 1] < rdiag[(long)(int)uVar11 + -1] ||
                rdiag[uVar19 - 1] == rdiag[(long)(int)uVar11 + -1]) {
              uVar5 = uVar11;
            }
            uVar19 = uVar19 + 1;
            uVar4 = (uint)uVar5;
            uVar11 = uVar5;
          } while (*puVar18 + 1 != uVar19);
        }
        if (uVar8 != uVar4) {
          uVar1 = *puVar15;
          if (0 < (int)uVar1) {
            iVar10 = uVar4 * (int)local_c0;
            lVar12 = 1;
            do {
              dVar22 = local_c8[uVar8 * local_c0 + lVar12];
              local_c8[uVar8 * local_c0 + lVar12] = local_c8[iVar10 + lVar12];
              local_c8[iVar10 + lVar12] = dVar22;
              lVar12 = lVar12 + 1;
            } while ((ulong)uVar1 + 1 != lVar12);
          }
          rdiag[(long)(int)uVar4 + -1] = rdiag[uVar8 - 1];
          wa[(long)(int)uVar4 + -1] = wa[uVar8 - 1];
          iVar10 = local_78[uVar8 - 1];
          local_78[uVar8 - 1] = local_78[(long)(int)uVar4 + -1];
          local_78[(long)(int)uVar4 + -1] = iVar10;
        }
      }
      local_d0 = (*puVar15 - uVar6) + 1;
      pdVar9 = local_c8 + uVar8 + (long)(int)((int)local_c0 * uVar6);
      dVar22 = enorm_((int *)&local_d0,pdVar9);
      pdVar3 = local_c8;
      piVar14 = local_b8;
      if ((dVar22 != 0.0) || (NAN(dVar22))) {
        dVar23 = *pdVar9;
        dVar22 = (double)(~-(ulong)(dVar23 < 0.0) & (ulong)dVar22 |
                         (ulong)-dVar22 & -(ulong)(dVar23 < 0.0));
        uVar4 = *puVar15;
        if ((long)uVar8 <= (long)(int)uVar4) {
          lVar12 = 0;
          do {
            *(double *)((long)local_c8 + lVar12 * 8 + local_80 * uVar8) =
                 *(double *)((long)local_c8 + lVar12 * 8 + local_80 * uVar8) / dVar22;
            lVar12 = lVar12 + 1;
          } while ((uVar4 + 1) - uVar8 != lVar12);
          dVar23 = *pdVar9;
        }
        *pdVar9 = dVar23 + 1.0;
        local_d0 = *puVar18;
        uVar19 = (ulong)(int)local_d0;
        local_98 = pdVar9;
        if ((long)uVar19 <= (long)uVar8) goto LAB_001035f7;
        local_60 = local_c8 + uVar8 + 1;
        lVar21 = local_70 * local_ac + uVar8 * 8 + (long)local_c8;
        lVar17 = local_80 * uVar8;
        local_90 = (double *)-uVar8;
        lVar12 = (long)local_ac;
        lVar16 = local_70;
        local_68 = uVar8 + 1;
        local_48 = dVar22;
        do {
          local_cc = *puVar15;
          if ((long)uVar8 <= (long)(int)local_cc) {
            lVar7 = (ulong)(local_cc + 1) + (long)local_90;
            dVar23 = 0.0;
            lVar13 = 0;
            do {
              dVar23 = dVar23 + *(double *)((long)pdVar3 + lVar13 * 8 + lVar17) *
                                *(double *)(lVar21 + lVar13 * 8);
              lVar13 = lVar13 + 1;
            } while (lVar7 != lVar13);
            dVar24 = *pdVar9;
            if ((long)uVar8 <= (long)(int)local_cc) {
              lVar13 = 0;
              do {
                *(double *)(lVar21 + lVar13 * 8) =
                     *(double *)((long)pdVar3 + lVar13 * 8 + lVar17) * (-dVar23 / dVar24) +
                     *(double *)(lVar21 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while (lVar7 != lVar13);
            }
          }
          if (*piVar14 != 0) {
            dVar23 = rdiag[lVar12 + -1];
            if ((dVar23 != 0.0) || (NAN(dVar23))) {
              dVar24 = 1.0 - (pdVar20[uVar8 + lVar12 * local_c0] / dVar23) *
                             (pdVar20[uVar8 + lVar12 * local_c0] / dVar23);
              dVar23 = SQRT((double)(~-(ulong)(dVar24 <= 0.0) & (ulong)dVar24)) * dVar23;
              rdiag[lVar12 + -1] = dVar23;
              dVar23 = dVar23 / wa[lVar12 + -1];
              if (dVar23 * dVar23 * 0.05 <= local_58) {
                local_cc = local_cc - uVar6;
                dVar22 = enorm_((int *)&local_cc,local_60 + lVar12 * local_c0);
                rdiag[lVar12 + -1] = dVar22;
                wa[lVar12 + -1] = dVar22;
                uVar19 = (ulong)local_d0;
                pdVar9 = local_98;
                piVar14 = local_b8;
                puVar15 = local_a8;
                lVar16 = local_70;
                dVar22 = local_48;
              }
            }
          }
          lVar21 = lVar21 + lVar16;
          bVar2 = lVar12 < (int)uVar19;
          lVar12 = lVar12 + 1;
          uVar11 = local_68;
          puVar18 = local_88;
        } while (bVar2);
      }
      else {
LAB_001035f7:
        uVar11 = uVar8 + 1;
      }
      rdiag[uVar8 - 1] = -dVar22;
      local_ac = local_ac + 1;
      uVar8 = uVar11;
    } while (uVar11 != local_a0);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(qrfac)(const int *m, const int *n, real *a, const int *
	lda, const int *pivot, int *ipvt, const int *lipvt, real *rdiag,
	 real *acnorm, real *wa)
{
    /* Initialized data */

#define p05 .05
    const int c__1 = 1;

    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3;
    real d__1, d__2, d__3;

    /* Local variables */
    int i__, j, k, jp1;
    real sum;
    int kmax;
    real temp;
    int minmn;
    real epsmch;
    real ajnorm;

/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa;
    --acnorm;
    --rdiag;
    a_dim1 = *lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;
    --ipvt;
    (void)lipvt;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

/*     compute the initial column norms and initialize several arrays. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	acnorm[j] = __minpack_func__(enorm)(m, &a[j * a_dim1 + 1]);
	rdiag[j] = acnorm[j];
	wa[j] = rdiag[j];
	if (*pivot) {
	    ipvt[j] = j;
	}
/* L10: */
    }

/*     reduce a to r with householder transformations. */

    minmn = min(*m,*n);
    i__1 = minmn;
    for (j = 1; j <= i__1; ++j) {
	if (! (*pivot)) {
	    goto L40;
	}

/*        bring the column of largest norm into the pivot position. */

	kmax = j;
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
	    if (rdiag[k] > rdiag[kmax]) {
		kmax = k;
	    }
/* L20: */
	}
	if (kmax == j) {
	    goto L40;
	}
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    temp = a[i__ + j * a_dim1];
	    a[i__ + j * a_dim1] = a[i__ + kmax * a_dim1];
	    a[i__ + kmax * a_dim1] = temp;
/* L30: */
	}
	rdiag[kmax] = rdiag[j];
	wa[kmax] = wa[j];
	k = ipvt[j];
	ipvt[j] = ipvt[kmax];
	ipvt[kmax] = k;
L40:

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

	i__2 = *m - j + 1;
	ajnorm = __minpack_func__(enorm)(&i__2, &a[j + j * a_dim1]);
	if (ajnorm == 0.) {
	    goto L100;
	}
	if (a[j + j * a_dim1] < 0.) {
	    ajnorm = -ajnorm;
	}
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    a[i__ + j * a_dim1] /= ajnorm;
/* L50: */
	}
	a[j + j * a_dim1] += 1;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

	jp1 = j + 1;
	if (*n < jp1) {
	    goto L100;
	}
	i__2 = *n;
	for (k = jp1; k <= i__2; ++k) {
	    sum = 0.;
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		sum += a[i__ + j * a_dim1] * a[i__ + k * a_dim1];
/* L60: */
	    }
	    temp = sum / a[j + j * a_dim1];
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		a[i__ + k * a_dim1] -= temp * a[i__ + j * a_dim1];
/* L70: */
	    }
	    if (! (*pivot) || rdiag[k] == 0.) {
		goto L80;
	    }
	    temp = a[j + k * a_dim1] / rdiag[k];
/* Computing MAX */
/* Computing 2nd power */
	    d__3 = temp;
	    d__1 = 0., d__2 = 1 - d__3 * d__3;
	    rdiag[k] *= sqrt((max(d__1,d__2)));
/* Computing 2nd power */
	    d__1 = rdiag[k] / wa[k];
	    if (p05 * (d__1 * d__1) > epsmch) {
		goto L80;
	    }
	    i__3 = *m - j;
	    rdiag[k] = __minpack_func__(enorm)(&i__3, &a[jp1 + k * a_dim1]);
	    wa[k] = rdiag[k];
L80:
/* L90: */
	    ;
	}
L100:
	rdiag[j] = -ajnorm;
/* L110: */
    }
    return;

/*     last card of subroutine qrfac. */

}